

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::SinkFormat::SinkFormat(SinkFormat *this,Filter *filter,string *format)

{
  string *in_RDX;
  Sink *in_RDI;
  Filter *in_stack_ffffffffffffffc8;
  
  Sink::Sink(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Sink = (_func_int **)&PTR__SinkFormat_0036ed68;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

SinkFormat(const Filter& filter, const std::string& format)
      : Sink(filter), format_(format) {}